

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::expandToDepth(QTreeView *this,int depth)

{
  QSet<QPersistentModelIndex> *this_00;
  QTreeViewPrivate *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  Entry *pEVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  pointer pQVar5;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar6;
  Hash HVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  QSet<QPersistentModelIndex> expandedIndexs;
  QSet<QPersistentModelIndex> collapsedIndexes;
  Hash local_78;
  undefined1 local_70 [16];
  Hash local_58;
  QHash<QPersistentModelIndex,_QHashDummyValue> local_50;
  void *local_48;
  QModelIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QList<QTreeViewItem>::clear(&this_01->viewItems);
  local_50.d = (Data *)0x0;
  this_00 = &this_01->expandedIndexes;
  QHash<QPersistentModelIndex,_QHashDummyValue>::operator=(&local_50,&this_00->q_hash);
  QHash<QPersistentModelIndex,_QHashDummyValue>::clear(&this_00->q_hash);
  QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_01->super_QAbstractItemViewPrivate);
  QTreeViewPrivate::layout(this_01,-1,false,false);
  uVar9 = (this_01->viewItems).d.size;
  if (uVar9 != 0) {
    lVar10 = 0;
    uVar8 = 0;
    do {
      if ((-1 < depth) &&
         ((uint)*(ushort *)(&((this_01->viewItems).d.ptr)->field_0x20 + lVar10) <= (uint)depth)) {
        pQVar5 = QList<QTreeViewItem>::data(&this_01->viewItems);
        (&pQVar5->field_0x1c)[lVar10] = (&pQVar5->field_0x1c)[lVar10] | 1;
        QTreeViewPrivate::layout(this_01,(int)uVar8,false,false);
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)local_70,
                   (QModelIndex *)((long)&(((this_01->viewItems).d.ptr)->index).r + lVar10));
        this_02 = (this_01->expandedIndexes).q_hash.d;
        if ((this_02 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) ||
           (pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>
                     ::findNode<QPersistentModelIndex>(this_02,(QPersistentModelIndex *)local_70),
           pNVar6 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0)) {
          QHash<QPersistentModelIndex,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QPersistentModelIndex,QHashDummyValue> *)this_00,
                     (QPersistentModelIndex *)local_70,(QHashDummyValue *)&local_48);
        }
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)local_70);
        uVar9 = (this_01->viewItems).d.size;
      }
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x28;
    } while (uVar8 < uVar9);
  }
  local_70._0_8_ = collapsed;
  local_70._8_8_ = 0;
  local_70 = QMetaMethod::fromSignalImpl(&staticMetaObject,(void **)local_70);
  bVar2 = QObject::isSignalConnected((QMetaMethod *)this);
  local_70._0_8_ = expanded;
  local_70._8_8_ = 0;
  local_70 = QMetaMethod::fromSignalImpl(&staticMetaObject,(void **)local_70);
  bVar3 = QObject::isSignalConnected((QMetaMethod *)this);
  if (((bVar3 | bVar2) != 1) ||
     ((*(uint *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget.field_0x8 + 0x30) & 2) != 0)) goto LAB_005a7513;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  operator-((QSet<QPersistentModelIndex> *)&local_58,(QSet<QPersistentModelIndex> *)&local_50);
  if (local_58.d == (Data *)0x0) {
    uVar9 = 0;
    HVar7.d = (Data *)0x0;
LAB_005a72e0:
    if (uVar9 != 0 || HVar7.d != (Data *)0x0) goto LAB_005a72ec;
  }
  else {
    HVar7.d = local_58.d;
    if ((local_58.d)->spans->offsets[0] == 0xff) {
      uVar8 = 1;
      do {
        uVar9 = uVar8;
        if ((local_58.d)->numBuckets == uVar9) {
          HVar7.d = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar8 = uVar9 + 1;
      } while ((local_58.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
      goto LAB_005a72e0;
    }
    uVar9 = 0;
LAB_005a72ec:
    do {
      bVar2 = (HVar7.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
      pEVar1 = (HVar7.d)->spans[uVar9 >> 7].entries;
      cVar4 = QPersistentModelIndex::isValid();
      if (cVar4 != '\0') {
        cVar4 = QPersistentModelIndex::flags();
        if (-1 < cVar4) {
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)local_70,(QPersistentModelIndex *)(pEVar1 + bVar2));
          local_48 = (void *)0x0;
          local_40 = (QModelIndex *)local_70;
          QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
        }
      }
      do {
        if ((HVar7.d)->numBuckets - 1 == uVar9) {
          uVar9 = 0;
          HVar7.d = (Data *)0x0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while ((HVar7.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while ((uVar9 != 0) || (HVar7.d != (Data *)0x0));
  }
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  operator-((QSet<QPersistentModelIndex> *)&local_78,this_00);
  if (local_78.d == (Data *)0x0) {
    uVar9 = 0;
    HVar7.d = (Data *)0x0;
LAB_005a742f:
    if (uVar9 != 0 || HVar7.d != (Data *)0x0) goto LAB_005a743b;
  }
  else {
    HVar7.d = local_78.d;
    if ((local_78.d)->spans->offsets[0] == 0xff) {
      uVar8 = 1;
      do {
        uVar9 = uVar8;
        if ((local_78.d)->numBuckets == uVar9) {
          HVar7.d = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar8 = uVar9 + 1;
      } while ((local_78.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
      goto LAB_005a742f;
    }
    uVar9 = 0;
LAB_005a743b:
    do {
      bVar2 = (HVar7.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
      pEVar1 = (HVar7.d)->spans[uVar9 >> 7].entries;
      cVar4 = QPersistentModelIndex::isValid();
      if (cVar4 != '\0') {
        cVar4 = QPersistentModelIndex::flags();
        if (-1 < cVar4) {
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)local_70,(QPersistentModelIndex *)(pEVar1 + bVar2));
          local_48 = (void *)0x0;
          local_40 = (QModelIndex *)local_70;
          QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
        }
      }
      do {
        if ((HVar7.d)->numBuckets - 1 == uVar9) {
          uVar9 = 0;
          HVar7.d = (Data *)0x0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while ((HVar7.d)->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while ((uVar9 != 0) || (HVar7.d != (Data *)0x0));
  }
  QHash<QPersistentModelIndex,_QHashDummyValue>::~QHash(&local_78);
  QHash<QPersistentModelIndex,_QHashDummyValue>::~QHash(&local_58);
LAB_005a7513:
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x268))(this);
  QWidget::update((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport);
  QTreeViewPrivate::updateAccessibility(this_01);
  QHash<QPersistentModelIndex,_QHashDummyValue>::~QHash(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::expandToDepth(int depth)
{
    Q_D(QTreeView);
    d->viewItems.clear();
    QSet<QPersistentModelIndex> old_expandedIndexes;
    old_expandedIndexes = d->expandedIndexes;
    d->expandedIndexes.clear();
    d->interruptDelayedItemsLayout();
    d->layout(-1);
    for (int i = 0; i < d->viewItems.size(); ++i) {
        if (q20::cmp_less_equal(d->viewItems.at(i).level, depth)) {
            d->viewItems[i].expanded = true;
            d->layout(i);
            d->storeExpanded(d->viewItems.at(i).index);
        }
    }

    bool someSignalEnabled = isSignalConnected(QMetaMethod::fromSignal(&QTreeView::collapsed));
    someSignalEnabled |= isSignalConnected(QMetaMethod::fromSignal(&QTreeView::expanded));

    if (!signalsBlocked() && someSignalEnabled) {
        // emit signals
        QSet<QPersistentModelIndex> collapsedIndexes = old_expandedIndexes - d->expandedIndexes;
        QSet<QPersistentModelIndex>::const_iterator i = collapsedIndexes.constBegin();
        for (; i != collapsedIndexes.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit collapsed(mi);
        }

        QSet<QPersistentModelIndex> expandedIndexs = d->expandedIndexes - old_expandedIndexes;
        i = expandedIndexs.constBegin();
        for (; i != expandedIndexs.constEnd(); ++i) {
            const QPersistentModelIndex &mi = (*i);
            if (mi.isValid() && !(mi.flags() & Qt::ItemNeverHasChildren))
                emit expanded(mi);
        }
    }

    updateGeometries();
    d->viewport->update();
    d->updateAccessibility();
}